

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O1

void anon_unknown.dwarf_103b2b::Json::check_error(string *src,error_code err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internal iVar2;
  parser<json_out_callbacks> *this;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  string res;
  parser<json_out_callbacks> p;
  AssertHelper local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  AssertHelper local_138;
  error_code local_130;
  result_type local_120;
  error_code local_fc;
  json_out_callbacks local_f8;
  undefined1 local_d0 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  local_c8;
  error_code local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_120._M_dataplus._M_p._0_4_ = 0;
  local_fc = err;
  testing::internal::CmpHelperNE<pstore::json::error_code,pstore::json::error_code>
            ((internal *)local_d0,"err","json::error_code::none",&local_fc,(error_code *)&local_120)
  ;
  iVar2 = local_d0[0];
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_c8.
        super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)
               local_c8.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_map)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((long *)CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_120._M_dataplus._M_p._4_4_,
                                     local_120._M_dataplus._M_p._0_4_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_c8.
      super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c8.
                 super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map);
  }
  if (iVar2 != (internal)0x0) {
    paVar1 = &local_f8.out_.field_2;
    local_f8.out_.field_2._8_8_ = 0;
    local_f8.out_._M_string_length = 0;
    local_f8.out_.field_2._M_allocated_capacity = 0;
    local_f8.out_._M_dataplus._M_p = (pointer)paVar1;
    pstore::json::parser<json_out_callbacks>::parser
              ((parser<json_out_callbacks> *)local_d0,&local_f8,none);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.out_._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.out_._M_dataplus._M_p,local_f8.out_.field_2._M_allocated_capacity + 1
                     );
    }
    this = pstore::json::parser<json_out_callbacks>::input
                     ((parser<json_out_callbacks> *)local_d0,src);
    pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_120,this);
    pcVar3 = "";
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
              ((internal *)&local_148,"res","\"\"",&local_120,(char (*) [1])0x18f79c);
    if (local_148.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if ((long *)CONCAT44(local_130._4_4_,local_130._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_130._4_4_,local_130._M_value) + 8))();
      }
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    local_130._M_cat = pstore::json::get_error_category();
    local_130._M_value = 0;
    testing::internal::CmpHelperNE<std::error_code,std::error_code>
              ((internal *)&local_148,"p.last_error ()","make_error_code (json::error_code::none)",
               &local_78,&local_130);
    if (local_148.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_140->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x24,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if ((long *)CONCAT44(local_130._4_4_,local_130._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_130._4_4_,local_130._M_value) + 8))();
      }
    }
    if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_140,local_140);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_) !=
        &local_120.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_120._M_dataplus._M_p._4_4_,local_120._M_dataplus._M_p._0_4_),
                      local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
    ::~deque(&local_c8);
    if ((void *)CONCAT71(local_d0._1_7_,local_d0[0]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_d0._1_7_,local_d0[0]),0x68);
    }
  }
  return;
}

Assistant:

static void check_error (std::string const & src, json::error_code err) {
            ASSERT_NE (err, json::error_code::none);
            json::parser<json_out_callbacks> p;
            std::string const res = p.input (src).eof ();
            EXPECT_EQ (res, "");
            EXPECT_NE (p.last_error (), make_error_code (json::error_code::none));
        }